

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraBddThresh.c
# Opt level: O3

int Extra_ThreshSelectWeights4(word *t,int nVars,int *pW)

{
  uint uVar1;
  uint uVar2;
  int Cost;
  int iVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  int Cost_1;
  int iVar7;
  uint uVar8;
  ulong uVar9;
  int i;
  long lVar10;
  bool bVar11;
  
  if (nVars != 4) {
    __assert_fail("nVars == 4",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/extrab/extraBddThresh.c"
                  ,0xbe,"int Extra_ThreshSelectWeights4(word *, int, int *)");
  }
  pW[3] = 1;
  uVar4 = 1;
  do {
    pW[2] = uVar4;
    uVar6 = uVar4;
    do {
      pW[1] = uVar6;
      uVar1 = uVar6;
      do {
        *pW = uVar1;
        uVar2 = uVar1;
        do {
          iVar3 = 10000;
          iVar7 = 0;
          uVar9 = 0;
          while( true ) {
            uVar8 = (uint)uVar9;
            lVar10 = 0;
            if ((t[uVar9 >> 6] >> (uVar9 & 0x3f) & 1) == 0) {
              iVar5 = 0;
              do {
                if ((uVar8 >> ((uint)lVar10 & 0x1f) & 1) != 0) {
                  iVar5 = iVar5 + pW[lVar10];
                }
                lVar10 = lVar10 + 1;
              } while (lVar10 != 4);
              if (iVar7 <= iVar5) {
                iVar7 = iVar5;
              }
            }
            else {
              iVar5 = 0;
              do {
                if ((uVar8 >> ((uint)lVar10 & 0x1f) & 1) != 0) {
                  iVar5 = iVar5 + pW[lVar10];
                }
                lVar10 = lVar10 + 1;
              } while (lVar10 != 4);
              if (iVar5 <= iVar3) {
                iVar3 = iVar5;
              }
            }
            if (iVar3 <= iVar7) break;
            uVar9 = (ulong)(uVar8 + 1);
            if (uVar8 + 1 == 0x10) {
              return iVar3;
            }
          }
          *pW = uVar2 + 1;
          bVar11 = uVar2 < 4;
          uVar2 = uVar2 + 1;
        } while (bVar11);
        pW[1] = uVar1 + 1;
        bVar11 = uVar1 < 4;
        uVar1 = uVar1 + 1;
      } while (bVar11);
      uVar6 = uVar6 + 1;
      pW[2] = uVar6;
    } while (uVar6 != 5);
    uVar4 = uVar4 + 1;
    pW[3] = uVar4;
    if (uVar4 == 5) {
      return 0;
    }
  } while( true );
}

Assistant:

int Extra_ThreshSelectWeights4(word * t, int nVars, int * pW) {
    int m, Lmin, Lmax, nMints = (1 << nVars);
    assert(nVars == 4);
    for (pW[3] = 1; pW[3] <= nVars; pW[3]++)
        for (pW[2] = pW[3]; pW[2] <= nVars; pW[2]++)
            for (pW[1] = pW[2]; pW[1] <= nVars; pW[1]++)
                for (pW[0] = pW[1]; pW[0] <= nVars; pW[0]++) {
                    Lmin = 10000;
                    Lmax = 0;
                    for (m = 0; m < nMints; m++) {
                        if (Abc_TtGetBit(t, m))
                            Lmin = Abc_MinInt(Lmin,
                                    Extra_ThreshWeightedSum(pW, nVars, m));
                        else
                            Lmax = Abc_MaxInt(Lmax,
                                    Extra_ThreshWeightedSum(pW, nVars, m));
                        if (Lmax >= Lmin)
                            break;
                    }
                    if (m < nMints)
                        continue;
                    assert(Lmax < Lmin);
                    return Lmin;
                }
    return 0;
}